

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O1

void __thiscall LFPConsumer::~LFPConsumer(LFPConsumer *this)

{
  pointer psVar1;
  pointer piVar2;
  
  (this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__LFPConsumer_002e7208;
  psVar1 = (this->temp).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1,(long)(this->temp).super__Vector_base<short,_std::allocator<short>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->args).dataRequested);
  piVar2 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->args).indices.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  HFSubConsumer::~HFSubConsumer(&this->super_HFSubConsumer);
  return;
}

Assistant:

LFPConsumer::~LFPConsumer(){

}